

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int lyd_new_path_list_predicate(lyd_node *list,char *list_name,char *predicate,int *parsed)

{
  uint uVar1;
  int iVar2;
  ushort **ppuVar3;
  lys_module *plVar4;
  lys_module *plVar5;
  char *pcVar6;
  lyd_node *plVar7;
  lys_node *plVar8;
  size_t sVar9;
  ulong uVar10;
  char *local_60;
  char *value;
  char *mod_name;
  int local_48;
  int local_44;
  int val_len;
  int has_predicate;
  char *name;
  int mod_name_len;
  int nam_len;
  
  plVar8 = list->schema;
  uVar1 = parse_schema_json_predicate
                    (predicate,&value,(int *)&name,(char **)&val_len,(int *)((long)&name + 4),
                     &local_60,&local_48,&local_44);
  pcVar6 = _val_len;
  if (((int)uVar1 < 1) || (iVar2 = strncmp(_val_len,".",(long)name._4_4_), iVar2 == 0)) {
    ly_vlog(plVar8->module->ctx,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
            (ulong)(uint)(int)predicate[-(long)(int)uVar1],predicate + -(long)(int)uVar1);
    return -1;
  }
  ppuVar3 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar3 + (long)*pcVar6 * 2 + 1) & 8) == 0) {
    if (plVar8->padding[2] != '\0') {
      uVar10 = 0;
      mod_name = (char *)plVar8;
      while( true ) {
        plVar8 = *(lys_node **)(*(long *)&plVar8[1].flags + uVar10 * 8);
        *parsed = *parsed + uVar1;
        if (local_60 == (char *)0x0) break;
        if (value == (char *)0x0) {
          plVar4 = lys_node_module(plVar8);
          plVar5 = lys_node_module((lys_node *)mod_name);
          if (plVar4 != plVar5) break;
        }
        if (value != (char *)0x0) {
          plVar4 = lys_node_module(plVar8);
          iVar2 = strncmp(plVar4->name,value,(long)(int)name);
          if ((iVar2 != 0) || (plVar4 = lys_node_module(plVar8), plVar4->name[(int)name] != '\0'))
          break;
        }
        pcVar6 = plVar8->name;
        sVar9 = (size_t)name._4_4_;
        iVar2 = strncmp(pcVar6,_val_len,sVar9);
        if ((iVar2 != 0) || (pcVar6[sVar9] != '\0')) break;
        sVar9 = (size_t)local_48;
        pcVar6 = (char *)malloc(sVar9 + 1);
        if (pcVar6 == (char *)0x0) {
          ly_log((ly_ctx *)**(undefined8 **)(mod_name + 0x30),LY_LLERR,LY_EMEM,
                 "Memory allocation failed (%s()).","lyd_new_path_list_predicate");
          return -1;
        }
        strncpy(pcVar6,local_60,sVar9);
        pcVar6[sVar9] = '\0';
        plVar7 = _lyd_new_leaf(list,plVar8,pcVar6,0,0);
        free(pcVar6);
        plVar8 = (lys_node *)mod_name;
        if (plVar7 == (lyd_node *)0x0) {
          return -1;
        }
        uVar10 = uVar10 + 1;
        if ((byte)mod_name[0x1e] <= uVar10) {
          return 0;
        }
        if (local_44 == 0) {
          ly_vlog((ly_ctx *)**(undefined8 **)(mod_name + 0x30),LYE_PATH_MISSKEY,LY_VLOG_NONE,
                  (void *)0x0,list_name);
          return -1;
        }
        predicate = predicate + uVar1;
        uVar1 = parse_schema_json_predicate
                          (predicate,&value,(int *)&name,(char **)&val_len,(int *)((long)&name + 4),
                           &local_60,&local_48,&local_44);
        if (((int)uVar1 < 1) || (iVar2 = strncmp(_val_len,".",(long)name._4_4_), iVar2 == 0)) {
          ly_vlog((ly_ctx *)**(undefined8 **)((long)plVar8 + 0x30),LYE_PATH_INCHAR,LY_VLOG_NONE,
                  (void *)0x0,(ulong)(uint)(int)predicate[-(long)(int)uVar1],
                  predicate + -(long)(int)uVar1);
          return -1;
        }
      }
      ly_vlog((ly_ctx *)**(undefined8 **)(mod_name + 0x30),LYE_PATH_INKEY,LY_VLOG_NONE,(void *)0x0,
              _val_len);
      return -1;
    }
  }
  else {
    *parsed = *parsed + uVar1;
  }
  return 0;
}

Assistant:

static int
lyd_new_path_list_predicate(struct lyd_node *list, const char *list_name, const char *predicate, int *parsed)
{
    const char *mod_name, *name, *value;
    char *key_val;
    int r, i, mod_name_len, nam_len, val_len, has_predicate;
    struct lys_node_list *slist;
    struct lys_node *key;

    slist = (struct lys_node_list *)list->schema;

    /* is the predicate a number? */
    if (((r = parse_schema_json_predicate(predicate, &mod_name, &mod_name_len, &name, &nam_len, &value, &val_len, &has_predicate)) < 1)
            || !strncmp(name, ".", nam_len)) {
        LOGVAL(slist->module->ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, predicate[-r], &predicate[-r]);
        return -1;
    }

    if (isdigit(name[0])) {
        /* position index - creating without keys */
        *parsed += r;
        return 0;
    }

    /* it's not a number, so there must be some keys */
    if (!slist->keys_size) {
        /* there are none, so pretend we did not parse anything to get invalid char error later */
        return 0;
    }

    /* go through all the keys */
    i = 0;
    goto check_parsed_values;

    for (; i < slist->keys_size; ++i) {
        if (!has_predicate) {
            LOGVAL(slist->module->ctx, LYE_PATH_MISSKEY, LY_VLOG_NONE, NULL, list_name);
            return -1;
        }

        if (((r = parse_schema_json_predicate(predicate, &mod_name, &mod_name_len, &name, &nam_len, &value, &val_len, &has_predicate)) < 1)
                || !strncmp(name, ".", nam_len)) {
            LOGVAL(slist->module->ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, predicate[-r], &predicate[-r]);
            return -1;
        }

check_parsed_values:
        key = (struct lys_node *)slist->keys[i];
        *parsed += r;
        predicate += r;

        if (!value || (!mod_name && (lys_node_module(key) != lys_node_module((struct lys_node *)slist)))
                || (mod_name && (strncmp(lys_node_module(key)->name, mod_name, mod_name_len) || lys_node_module(key)->name[mod_name_len]))
                || strncmp(key->name, name, nam_len) || key->name[nam_len]) {
            LOGVAL(slist->module->ctx, LYE_PATH_INKEY, LY_VLOG_NONE, NULL, name);
            return -1;
        }

        key_val = malloc((val_len + 1) * sizeof(char));
        LY_CHECK_ERR_RETURN(!key_val, LOGMEM(slist->module->ctx), -1);
        strncpy(key_val, value, val_len);
        key_val[val_len] = '\0';

        if (!_lyd_new_leaf(list, key, key_val, 0, 0)) {
            free(key_val);
            return -1;
        }
        free(key_val);
    }

    return 0;
}